

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O3

void __thiscall
Web_Constraint::Changed
          (Web_Constraint *this,Am_Slot *slot_changed,Am_Constraint *changing_constraint)

{
  Input_Port *pIVar1;
  Am_Web_Data *this_00;
  Input_Port *curr;
  Input_Port *pIVar2;
  bool temp_changed;
  Am_Value temp_value;
  bool local_29;
  Am_Value local_28;
  
  if ((Web_Constraint *)changing_constraint != this) {
    this_00 = this->owner;
    pIVar2 = this_00->in_list;
    do {
      if ((pIVar2->context).data == slot_changed->data) {
        if (pIVar2->changed == true) {
          local_28.type = 0;
          local_28.value.wrapper_value = (Am_Wrapper *)0x0;
          Am_Web_Data::Validate(this_00,slot_changed,&local_28,&local_29);
          Am_Value::~Am_Value(&local_28);
          this_00 = this->owner;
        }
        pIVar2->changed = true;
        pIVar1 = this_00->changed_last;
        pIVar2->prev_changed = pIVar1;
        if (pIVar1 != (Input_Port *)0x0) {
          pIVar1->next_changed = pIVar2;
        }
        this_00->changed_last = pIVar2;
        if (this_00->changed_first == (Input_Port *)0x0) {
          this_00->changed_first = pIVar2;
        }
        Am_Web_Data::Invalidate(this_00,slot_changed);
        return;
      }
      pIVar2 = pIVar2->next;
    } while (pIVar2 != (Input_Port *)0x0);
  }
  return;
}

Assistant:

void
Web_Constraint::Changed(const Am_Slot &slot_changed,
                        Am_Constraint *changing_constraint)
{
  if (changing_constraint == this)
    return;
  Input_Port *port = owner->in_list->Search(slot_changed);
  if (!port)
    return;
  if (port->changed) {
    Am_Value temp_value;
    bool temp_changed;
    owner->Validate(slot_changed, temp_value, temp_changed);
  }
  owner->Enqueue(port);
  /*if (!slot_changed)*/
  owner->Invalidate(slot_changed);
}